

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# djpeg.c
# Opt level: O1

int parse_switches(j_decompress_ptr cinfo,int argc,char **argv,int last_file_arg_seen,
                  boolean for_real)

{
  int *piVar1;
  boolean bVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  int iVar5;
  char ch;
  char c;
  long lval;
  int val;
  byte local_5a;
  byte local_59;
  long local_58;
  int local_50;
  int local_4c;
  long local_48;
  uint *local_40;
  uint *local_38;
  
  requested_fmt = FMT_PPM;
  icc_filename = (char *)0x0;
  max_scans = 0;
  outfilename = (char *)0x0;
  memsrc = 0;
  report = 0;
  skip = 0;
  crop = 0;
  strict = 0;
  cinfo->err->trace_level = 0;
  iVar5 = 1;
  if (1 < argc) {
    local_38 = &cinfo->scale_num;
    local_40 = &cinfo->scale_denom;
    local_50 = last_file_arg_seen;
    do {
      iVar3 = iVar5;
      if (*argv[iVar5] == '-') {
        pcVar4 = argv[iVar5] + 1;
        bVar2 = keymatch(pcVar4,"bmp",1);
        if (bVar2 == 0) {
          bVar2 = keymatch(pcVar4,"colors",1);
          if ((((bVar2 == 0) && (bVar2 = keymatch(pcVar4,"colours",1), bVar2 == 0)) &&
              (bVar2 = keymatch(pcVar4,"quantize",1), bVar2 == 0)) &&
             (bVar2 = keymatch(pcVar4,"quantise",1), bVar2 == 0)) {
            bVar2 = keymatch(pcVar4,"dct",2);
            if (bVar2 == 0) {
              bVar2 = keymatch(pcVar4,"dither",2);
              if (bVar2 == 0) {
                bVar2 = keymatch(pcVar4,"debug",1);
                if ((bVar2 == 0) && (bVar2 = keymatch(pcVar4,"verbose",1), bVar2 == 0)) {
                  bVar2 = keymatch(pcVar4,"version",4);
                  if (bVar2 != 0) goto LAB_001066bc;
                  bVar2 = keymatch(pcVar4,"fast",1);
                  if (bVar2 == 0) {
                    bVar2 = keymatch(pcVar4,"gif",1);
                    if (bVar2 == 0) {
                      bVar2 = keymatch(pcVar4,"gif0",4);
                      if (bVar2 == 0) {
                        bVar2 = keymatch(pcVar4,"grayscale",2);
                        if ((bVar2 == 0) && (bVar2 = keymatch(pcVar4,"greyscale",2), bVar2 == 0)) {
                          bVar2 = keymatch(pcVar4,"rgb",2);
                          if (bVar2 == 0) {
                            bVar2 = keymatch(pcVar4,"rgb565",2);
                            if (bVar2 == 0) {
                              bVar2 = keymatch(pcVar4,"icc",1);
                              if (bVar2 == 0) {
                                bVar2 = keymatch(pcVar4,"map",3);
                                if (bVar2 == 0) {
                                  bVar2 = keymatch(pcVar4,"maxmemory",3);
                                  if (bVar2 == 0) {
                                    bVar2 = keymatch(pcVar4,"maxscans",4);
                                    if (bVar2 == 0) {
                                      bVar2 = keymatch(pcVar4,"nosmooth",3);
                                      if (bVar2 == 0) {
                                        bVar2 = keymatch(pcVar4,"onepass",3);
                                        if (bVar2 == 0) {
                                          bVar2 = keymatch(pcVar4,"os2",3);
                                          if (bVar2 == 0) {
                                            bVar2 = keymatch(pcVar4,"outfile",4);
                                            if (bVar2 == 0) {
                                              bVar2 = keymatch(pcVar4,"memsrc",2);
                                              if (bVar2 == 0) {
                                                bVar2 = keymatch(pcVar4,"pnm",1);
                                                if ((bVar2 == 0) &&
                                                   (bVar2 = keymatch(pcVar4,"ppm",1), bVar2 == 0)) {
                                                  bVar2 = keymatch(pcVar4,"report",2);
                                                  if (bVar2 == 0) {
                                                    bVar2 = keymatch(pcVar4,"scale",2);
                                                    if (bVar2 == 0) {
                                                      bVar2 = keymatch(pcVar4,"skip",2);
                                                      if (bVar2 == 0) {
                                                        bVar2 = keymatch(pcVar4,"crop",2);
                                                        if (bVar2 == 0) {
                                                          bVar2 = keymatch(pcVar4,"strict",2);
                                                          if (bVar2 == 0) {
                                                            bVar2 = keymatch(pcVar4,"targa",1);
                                                            if (bVar2 == 0) goto LAB_001066b7;
                                                            requested_fmt = FMT_TARGA;
                                                          }
                                                          else {
                                                            strict = 1;
                                                          }
                                                        }
                                                        else {
                                                          iVar3 = iVar5 + 1;
                                                          if ((((argc <= iVar3) ||
                                                               (iVar5 = __isoc99_sscanf(argv[iVar3],
                                                                                                                                                                                
                                                  "%u%c%u+%u+%u",&crop_width,&local_59,&crop_height,
                                                  &crop_x,&crop_y), iVar5 != 5)) ||
                                                  ((local_59 & 0xdf) != 0x58)) ||
                                                  ((crop_width == 0 || (crop_height == 0))))
                                                  goto LAB_001066b7;
                                                  crop = 1;
                                                  }
                                                  }
                                                  else {
                                                    iVar3 = iVar5 + 1;
                                                    if (((argc <= iVar3) ||
                                                        (iVar5 = __isoc99_sscanf(argv[iVar3],"%u,%u"
                                                                                 ,&skip_start,
                                                                                 &skip_end),
                                                        iVar5 != 2)) || (skip_end < skip_start))
                                                    goto LAB_001066b7;
                                                    skip = 1;
                                                  }
                                                  }
                                                  else {
                                                    iVar3 = iVar5 + 1;
                                                    if ((argc <= iVar3) ||
                                                       (iVar5 = __isoc99_sscanf(argv[iVar3],"%u/%u",
                                                                                local_38,local_40),
                                                       iVar5 != 2)) goto LAB_001066b7;
                                                  }
                                                  }
                                                  else {
                                                    report = 1;
                                                  }
                                                }
                                                else {
                                                  requested_fmt = FMT_PPM;
                                                }
                                              }
                                              else {
                                                memsrc = 1;
                                              }
                                            }
                                            else {
                                              iVar3 = iVar5 + 1;
                                              if (argc <= iVar3) goto LAB_001066b7;
                                              outfilename = argv[iVar3];
                                            }
                                          }
                                          else {
                                            requested_fmt = FMT_OS2;
                                          }
                                        }
                                        else {
                                          cinfo->two_pass_quantize = 0;
                                        }
                                      }
                                      else {
                                        cinfo->do_fancy_upsampling = 0;
                                      }
                                    }
                                    else {
                                      iVar3 = iVar5 + 1;
                                      if ((argc <= iVar3) ||
                                         (iVar5 = __isoc99_sscanf(argv[iVar3],"%u",&max_scans),
                                         iVar5 != 1)) goto LAB_001066b7;
                                    }
                                  }
                                  else {
                                    local_5a = 0x78;
                                    iVar3 = iVar5 + 1;
                                    if ((argc <= iVar3) ||
                                       (iVar5 = __isoc99_sscanf(argv[iVar3],"%ld%c",&local_58,
                                                                &local_5a), iVar5 < 1))
                                    goto LAB_001066b7;
                                    if ((local_5a & 0xdf) == 0x4d) {
                                      local_58 = local_58 * 1000;
                                    }
                                    cinfo->mem->max_memory_to_use = local_58 * 1000;
                                  }
                                }
                                else {
                                  iVar3 = iVar5 + 1;
                                  if (argc <= iVar3) goto LAB_001066b7;
                                  if (local_50 != 0) {
                                    local_48 = (long)iVar3;
                                    __stream = fopen(argv[local_48],"rb");
                                    if (__stream == (FILE *)0x0) goto LAB_001066c1;
                                    read_color_map(cinfo,(FILE *)__stream);
                                    fclose(__stream);
                                    goto LAB_00105f77;
                                  }
                                }
                              }
                              else {
                                iVar3 = iVar5 + 1;
                                if (argc <= iVar3) goto LAB_001066b7;
                                icc_filename = argv[iVar3];
                                jpeg_save_markers(cinfo,0xe2,0xffff);
                              }
                            }
                            else {
                              cinfo->out_color_space = JCS_RGB565;
                            }
                          }
                          else {
                            cinfo->out_color_space = JCS_RGB;
                          }
                        }
                        else {
                          cinfo->out_color_space = JCS_GRAYSCALE;
                        }
                      }
                      else {
                        requested_fmt = FMT_GIF0;
                      }
                    }
                    else {
                      requested_fmt = FMT_GIF;
                    }
                  }
                  else {
                    cinfo->dither_mode = JDITHER_ORDERED;
                    cinfo->two_pass_quantize = 0;
                    if (cinfo->quantize_colors == 0) {
                      cinfo->desired_number_of_colors = 0xd8;
                    }
                    cinfo->dct_method = JDCT_IFAST;
                    cinfo->do_fancy_upsampling = 0;
                  }
                }
                else {
                  if (parse_switches_printed_version == '\0') {
                    parse_switches_cold_1();
                  }
                  piVar1 = &cinfo->err->trace_level;
                  *piVar1 = *piVar1 + 1;
                }
              }
              else {
                iVar3 = iVar5 + 1;
                if (argc <= iVar3) goto LAB_001066b7;
                bVar2 = keymatch(argv[iVar3],"fs",2);
                if (bVar2 == 0) {
                  bVar2 = keymatch(argv[iVar3],"none",2);
                  if (bVar2 == 0) {
                    bVar2 = keymatch(argv[iVar3],"ordered",2);
                    if (bVar2 == 0) goto LAB_001066b7;
                    cinfo->dither_mode = JDITHER_ORDERED;
                  }
                  else {
                    cinfo->dither_mode = JDITHER_NONE;
                  }
                }
                else {
                  cinfo->dither_mode = JDITHER_FS;
                }
              }
            }
            else {
              iVar3 = iVar5 + 1;
              if (argc <= iVar3) goto LAB_001066b7;
              bVar2 = keymatch(argv[iVar3],"int",1);
              if (bVar2 == 0) {
                bVar2 = keymatch(argv[iVar3],"fast",2);
                if (bVar2 == 0) {
                  bVar2 = keymatch(argv[iVar3],"float",2);
                  if (bVar2 == 0) goto LAB_001066b7;
                  cinfo->dct_method = JDCT_FLOAT;
                }
                else {
                  cinfo->dct_method = JDCT_IFAST;
                }
              }
              else {
                cinfo->dct_method = JDCT_ISLOW;
              }
            }
          }
          else {
            if ((argc <= iVar5 + 1) ||
               (iVar3 = __isoc99_sscanf(argv[iVar5 + 1],"%d",&local_4c), iVar3 != 1)) {
LAB_001066b7:
              usage();
LAB_001066bc:
              parse_switches_cold_2();
LAB_001066c1:
              iVar5 = (int)local_48;
              parse_switches_cold_3();
              pcVar4 = *argv;
              if (-1 < iVar5) {
                if (*(int *)(pcVar4 + 0x7c) < iVar5) {
                  return (int)pcVar4;
                }
                pcVar4 = pcVar4 + 0x10;
              }
              iVar5 = (**(code **)pcVar4)();
              return iVar5;
            }
            cinfo->desired_number_of_colors = local_4c;
LAB_00105f77:
            cinfo->quantize_colors = 1;
            iVar3 = iVar5 + 1;
          }
        }
        else {
          requested_fmt = FMT_BMP;
        }
      }
      else {
        if (0 < iVar5) {
          return iVar5;
        }
        outfilename = (char *)0x0;
      }
      iVar5 = iVar3 + 1;
    } while (iVar5 < argc);
  }
  return iVar5;
}

Assistant:

LOCAL(int)
parse_switches(j_decompress_ptr cinfo, int argc, char **argv,
               int last_file_arg_seen, boolean for_real)
/* Parse optional switches.
 * Returns argv[] index of first file-name argument (== argc if none).
 * Any file names with indexes <= last_file_arg_seen are ignored;
 * they have presumably been processed in a previous iteration.
 * (Pass 0 for last_file_arg_seen on the first or only iteration.)
 * for_real is FALSE on the first (dummy) pass; we may skip any expensive
 * processing.
 */
{
  int argn;
  char *arg;

  /* Set up default JPEG parameters. */
  requested_fmt = DEFAULT_FMT;  /* set default output file format */
  icc_filename = NULL;
  max_scans = 0;
  outfilename = NULL;
  memsrc = FALSE;
  report = FALSE;
  skip = FALSE;
  crop = FALSE;
  strict = FALSE;
  cinfo->err->trace_level = 0;

  /* Scan command line options, adjust parameters */

  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (*arg != '-') {
      /* Not a switch, must be a file name argument */
      if (argn <= last_file_arg_seen) {
        outfilename = NULL;     /* -outfile applies to just one input file */
        continue;               /* ignore this name if previously processed */
      }
      break;                    /* else done parsing switches */
    }
    arg++;                      /* advance past switch marker character */

    if (keymatch(arg, "bmp", 1)) {
      /* BMP output format (Windows flavor). */
      requested_fmt = FMT_BMP;

    } else if (keymatch(arg, "colors", 1) || keymatch(arg, "colours", 1) ||
               keymatch(arg, "quantize", 1) || keymatch(arg, "quantise", 1)) {
      /* Do color quantization. */
      int val;

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%d", &val) != 1)
        usage();
      cinfo->desired_number_of_colors = val;
      cinfo->quantize_colors = TRUE;

    } else if (keymatch(arg, "dct", 2)) {
      /* Select IDCT algorithm. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "int", 1)) {
        cinfo->dct_method = JDCT_ISLOW;
      } else if (keymatch(argv[argn], "fast", 2)) {
        cinfo->dct_method = JDCT_IFAST;
      } else if (keymatch(argv[argn], "float", 2)) {
        cinfo->dct_method = JDCT_FLOAT;
      } else
        usage();

    } else if (keymatch(arg, "dither", 2)) {
      /* Select dithering algorithm. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (keymatch(argv[argn], "fs", 2)) {
        cinfo->dither_mode = JDITHER_FS;
      } else if (keymatch(argv[argn], "none", 2)) {
        cinfo->dither_mode = JDITHER_NONE;
      } else if (keymatch(argv[argn], "ordered", 2)) {
        cinfo->dither_mode = JDITHER_ORDERED;
      } else
        usage();

    } else if (keymatch(arg, "debug", 1) || keymatch(arg, "verbose", 1)) {
      /* Enable debug printouts. */
      /* On first -d, print version identification */
      static boolean printed_version = FALSE;

      if (!printed_version) {
        fprintf(stderr, "%s version %s (build %s)\n",
                PACKAGE_NAME, VERSION, BUILD);
        fprintf(stderr, "%s\n\n", JCOPYRIGHT);
        fprintf(stderr, "Emulating The Independent JPEG Group's software, version %s\n\n",
                JVERSION);
        printed_version = TRUE;
      }
      cinfo->err->trace_level++;

    } else if (keymatch(arg, "version", 4)) {
      fprintf(stderr, "%s version %s (build %s)\n",
              PACKAGE_NAME, VERSION, BUILD);
      exit(EXIT_SUCCESS);

    } else if (keymatch(arg, "fast", 1)) {
      /* Select recommended processing options for quick-and-dirty output. */
      cinfo->two_pass_quantize = FALSE;
      cinfo->dither_mode = JDITHER_ORDERED;
      if (!cinfo->quantize_colors) /* don't override an earlier -colors */
        cinfo->desired_number_of_colors = 216;
      cinfo->dct_method = JDCT_FASTEST;
      cinfo->do_fancy_upsampling = FALSE;

    } else if (keymatch(arg, "gif", 1)) {
      /* GIF output format (LZW-compressed). */
      requested_fmt = FMT_GIF;

    } else if (keymatch(arg, "gif0", 4)) {
      /* GIF output format (uncompressed). */
      requested_fmt = FMT_GIF0;

    } else if (keymatch(arg, "grayscale", 2) ||
               keymatch(arg, "greyscale", 2)) {
      /* Force monochrome output. */
      cinfo->out_color_space = JCS_GRAYSCALE;

    } else if (keymatch(arg, "rgb", 2)) {
      /* Force RGB output. */
      cinfo->out_color_space = JCS_RGB;

    } else if (keymatch(arg, "rgb565", 2)) {
      /* Force RGB565 output. */
      cinfo->out_color_space = JCS_RGB565;

    } else if (keymatch(arg, "icc", 1)) {
      /* Set ICC filename. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      icc_filename = argv[argn];
      jpeg_save_markers(cinfo, JPEG_APP0 + 2, 0xFFFF);

    } else if (keymatch(arg, "map", 3)) {
      /* Quantize to a color map taken from an input file. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (for_real) {           /* too expensive to do twice! */
#ifdef QUANT_2PASS_SUPPORTED    /* otherwise can't quantize to supplied map */
        FILE *mapfile;

        if ((mapfile = fopen(argv[argn], READ_BINARY)) == NULL) {
          fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
          exit(EXIT_FAILURE);
        }
        read_color_map(cinfo, mapfile);
        fclose(mapfile);
        cinfo->quantize_colors = TRUE;
#else
        ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
      }

    } else if (keymatch(arg, "maxmemory", 3)) {
      /* Maximum memory in Kb (or Mb with 'm'). */
      long lval;
      char ch = 'x';

      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%ld%c", &lval, &ch) < 1)
        usage();
      if (ch == 'm' || ch == 'M')
        lval *= 1000L;
      cinfo->mem->max_memory_to_use = lval * 1000L;

    } else if (keymatch(arg, "maxscans", 4)) {
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%u", &max_scans) != 1)
        usage();

    } else if (keymatch(arg, "nosmooth", 3)) {
      /* Suppress fancy upsampling */
      cinfo->do_fancy_upsampling = FALSE;

    } else if (keymatch(arg, "onepass", 3)) {
      /* Use fast one-pass quantization. */
      cinfo->two_pass_quantize = FALSE;

    } else if (keymatch(arg, "os2", 3)) {
      /* BMP output format (OS/2 flavor). */
      requested_fmt = FMT_OS2;

    } else if (keymatch(arg, "outfile", 4)) {
      /* Set output file name. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      outfilename = argv[argn]; /* save it away for later use */

    } else if (keymatch(arg, "memsrc", 2)) {
      /* Use in-memory source manager */
#if JPEG_LIB_VERSION >= 80 || defined(MEM_SRCDST_SUPPORTED)
      memsrc = TRUE;
#else
      fprintf(stderr, "%s: sorry, in-memory source manager was not compiled in\n",
              progname);
      exit(EXIT_FAILURE);
#endif

    } else if (keymatch(arg, "pnm", 1) || keymatch(arg, "ppm", 1)) {
      /* PPM/PGM output format. */
      requested_fmt = FMT_PPM;

    } else if (keymatch(arg, "report", 2)) {
      report = TRUE;

    } else if (keymatch(arg, "scale", 2)) {
      /* Scale the output image by a fraction M/N. */
      if (++argn >= argc)       /* advance to next argument */
        usage();
      if (sscanf(argv[argn], "%u/%u",
                 &cinfo->scale_num, &cinfo->scale_denom) != 2)
        usage();

    } else if (keymatch(arg, "skip", 2)) {
      if (++argn >= argc)
        usage();
      if (sscanf(argv[argn], "%u,%u", &skip_start, &skip_end) != 2 ||
          skip_start > skip_end)
        usage();
      skip = TRUE;

    } else if (keymatch(arg, "crop", 2)) {
      char c;
      if (++argn >= argc)
        usage();
      if (sscanf(argv[argn], "%u%c%u+%u+%u", &crop_width, &c, &crop_height,
                 &crop_x, &crop_y) != 5 ||
          (c != 'X' && c != 'x') || crop_width < 1 || crop_height < 1)
        usage();
      crop = TRUE;

    } else if (keymatch(arg, "strict", 2)) {
      strict = TRUE;

    } else if (keymatch(arg, "targa", 1)) {
      /* Targa output format. */
      requested_fmt = FMT_TARGA;

    } else {
      usage();                  /* bogus switch */
    }
  }

  return argn;                  /* return index of next arg (file name) */
}